

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyncAwait.h
# Opt level: O0

pair<std::error_code,_int> *
async_simple::coro::syncAwait<async_simple::coro::Lazy<std::pair<std::error_code,int>>>
          (Lazy<std::pair<std::error_code,_int>_> *lazy)

{
  undefined4 uVar1;
  pair<std::error_code,_int> *ppVar2;
  pair<std::error_code,_int> *in_RDI;
  Try<std::pair<std::error_code,_int>_> value;
  Condition cond;
  Executor *executor;
  counting_semaphore<1L> *in_stack_ffffffffffffff78;
  Condition *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  type_conflict6 *callback;
  undefined8 in_stack_ffffffffffffff90;
  undefined1 x;
  Try<std::pair<std::error_code,_int>_> *this;
  Try<std::pair<std::error_code,_int>_> local_38;
  type_conflict6 local_14;
  
  x = (undefined1)((ulong)in_stack_ffffffffffffff90 >> 0x38);
  local_14._4_8_ =
       detail::LazyBase<std::pair<std::error_code,_int>,_false>::getExecutor
                 ((LazyBase<std::pair<std::error_code,_int>,_false> *)0x66f076);
  if ((Executor *)local_14._4_8_ != (Executor *)0x0) {
    (*((Executor *)local_14._4_8_)->_vptr_Executor[3])();
    logicAssert((bool)x,in_stack_ffffffffffffff88);
  }
  callback = &local_14;
  util::Condition::Condition(in_stack_ffffffffffffff80,(ptrdiff_t)in_stack_ffffffffffffff78);
  this = &local_38;
  Try<std::pair<std::error_code,_int>_>::Try((Try<std::pair<std::error_code,_int>_> *)0x66f0c4);
  detail::LazyBase<std::pair<std::error_code,_int>,_false>::
  start<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_include_async_simple_coro_SyncAwait_h:44:16)>
            ((LazyBase<std::pair<std::error_code,_int>,_false> *)this,callback);
  std::counting_semaphore<1L>::acquire(in_stack_ffffffffffffff78);
  ppVar2 = Try<std::pair<std::error_code,_int>_>::value(this);
  uVar1 = *(undefined4 *)&(ppVar2->first).field_0x4;
  (in_RDI->first)._M_value = (ppVar2->first)._M_value;
  *(undefined4 *)&(in_RDI->first).field_0x4 = uVar1;
  (in_RDI->first)._M_cat = (ppVar2->first)._M_cat;
  uVar1 = *(undefined4 *)&ppVar2->field_0x14;
  in_RDI->second = ppVar2->second;
  *(undefined4 *)&in_RDI->field_0x14 = uVar1;
  Try<std::pair<std::error_code,_int>_>::~Try((Try<std::pair<std::error_code,_int>_> *)0x66f131);
  return in_RDI;
}

Assistant:

inline auto syncAwait(LazyType &&lazy) {
    auto executor = lazy.getExecutor();
    if (executor)
        logicAssert(!executor->currentThreadInExecutor(),
                    "do not sync await in the same executor with Lazy");

    util::Condition cond;
    using ValueType = typename std::decay_t<LazyType>::ValueType;

    Try<ValueType> value;
    std::move(std::forward<LazyType>(lazy))
        .start([&cond, &value](Try<ValueType> result) {
            value = std::move(result);
            cond.release();
        });
    cond.acquire();
    return std::move(value).value();
}